

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_get.c
# Opt level: O0

int buffer_feed(buffer *s)

{
  int r;
  buffer *s_local;
  
  if (s->p == 0) {
    s_local._4_4_ = oneread(s->op,s->fd,s->x,s->n);
    if (0 < (int)s_local._4_4_) {
      s->p = s_local._4_4_;
      s->n = s->n - s_local._4_4_;
      if (s->n != 0) {
        byte_copyr(s->x + s->n,s_local._4_4_,s->x);
      }
    }
  }
  else {
    s_local._4_4_ = s->p;
  }
  return s_local._4_4_;
}

Assistant:

int buffer_feed(buffer *s)
{
  int r;

  if (s->p) return s->p;
  r = oneread(s->op,s->fd,s->x,s->n);
  if (r <= 0) return r;
  s->p = r;
  s->n -= r;
  if (s->n > 0) byte_copyr(s->x + s->n,r,s->x);
  return r;
}